

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

bool jbcoin::amountFromJsonNoThrow(STAmount *result,Value *jvSource)

{
  exception *e;
  STAmount local_68;
  Value *local_20;
  Value *jvSource_local;
  STAmount *result_local;
  
  local_20 = jvSource;
  jvSource_local = (Value *)result;
  amountFromJson(&local_68,(SField *)sfGeneric,jvSource);
  STAmount::operator=((STAmount *)jvSource_local,&local_68);
  STAmount::~STAmount(&local_68);
  return true;
}

Assistant:

bool
amountFromJsonNoThrow (STAmount& result, Json::Value const& jvSource)
{
    try
    {
        result = amountFromJson (sfGeneric, jvSource);
        return true;
    }
    catch (const std::exception& e)
    {
        JLOG (debugLog().warn()) <<
            "amountFromJsonNoThrow: caught: " << e.what ();
    }
    return false;
}